

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

void __thiscall icu_63::MessagePattern::~MessagePattern(MessagePattern *this)

{
  void *in_RSI;
  
  ~MessagePattern(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

MessagePattern::~MessagePattern() {
    delete partsList;
    delete numericValuesList;
}